

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Image.c
# Opt level: O1

Vec_Ptr_t * Llb_Nonlin4CutNodes(Aig_Man_t *p,Vec_Ptr_t *vLower,Vec_Ptr_t *vUpper)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *vNodes;
  void **ppvVar3;
  long lVar4;
  
  Aig_ManIncrementTravId(p);
  iVar1 = vLower->nSize;
  if (0 < (long)iVar1) {
    ppvVar3 = vLower->pArray;
    iVar2 = p->nTravIds;
    lVar4 = 0;
    do {
      *(int *)((long)ppvVar3[lVar4] + 0x20) = iVar2;
      lVar4 = lVar4 + 1;
    } while (iVar1 != lVar4);
  }
  vNodes = (Vec_Ptr_t *)malloc(0x10);
  vNodes->nCap = 100;
  vNodes->nSize = 0;
  ppvVar3 = (void **)malloc(800);
  vNodes->pArray = ppvVar3;
  if (0 < vUpper->nSize) {
    lVar4 = 0;
    do {
      Llb_Nonlin4CutNodes_rec(p,(Aig_Obj_t *)vUpper->pArray[lVar4],vNodes);
      lVar4 = lVar4 + 1;
    } while (lVar4 < vUpper->nSize);
  }
  return vNodes;
}

Assistant:

Vec_Ptr_t * Llb_Nonlin4CutNodes( Aig_Man_t * p, Vec_Ptr_t * vLower, Vec_Ptr_t * vUpper )
{
    Vec_Ptr_t * vNodes;
    Aig_Obj_t * pObj;
    int i;
    // mark the lower cut with the traversal ID
    Aig_ManIncrementTravId(p);
    Vec_PtrForEachEntry( Aig_Obj_t *, vLower, pObj, i )
        Aig_ObjSetTravIdCurrent( p, pObj );
    // count the upper cut
    vNodes = Vec_PtrAlloc( 100 );
    Vec_PtrForEachEntry( Aig_Obj_t *, vUpper, pObj, i )
        Llb_Nonlin4CutNodes_rec( p, pObj, vNodes );
    return vNodes;
}